

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPartReg.c
# Opt level: O2

Vec_Ptr_t * Aig_ManRegPartitionSimple(Aig_Man_t *pAig,int nPartSize,int nOverSize)

{
  Vec_Ptr_t *p;
  Vec_Int_t *p_00;
  int iVar1;
  int iVar2;
  int Entry;
  int iVar3;
  
  if (nPartSize <= nOverSize) {
    printf("Overlap size (%d) is more or equal than the partition size (%d).\n",
           (ulong)(uint)nOverSize,nPartSize);
    puts("Adjusting it to be equal to half of the partition size.");
    nOverSize = nPartSize / 2;
  }
  if (nOverSize < nPartSize) {
    p = Vec_PtrAlloc(100);
    iVar3 = 0;
    iVar1 = 0;
    if (0 < nPartSize) {
      iVar1 = nPartSize;
    }
    for (; iVar3 < pAig->nRegs; iVar3 = (iVar3 - nOverSize) - iVar2) {
      p_00 = Vec_IntAlloc(nPartSize);
      Entry = iVar3;
      for (iVar2 = 0; -iVar1 != iVar2; iVar2 = iVar2 + -1) {
        if (Entry < pAig->nRegs) {
          Vec_IntPush(p_00,Entry);
        }
        Entry = Entry + 1;
      }
      if (nOverSize < p_00->nSize) {
        Vec_PtrPush(p,p_00);
      }
      else {
        Vec_IntFree(p_00);
      }
    }
    return p;
  }
  __assert_fail("nOverSize < nPartSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigPartReg.c"
                ,0x1e5,"Vec_Ptr_t *Aig_ManRegPartitionSimple(Aig_Man_t *, int, int)");
}

Assistant:

Vec_Ptr_t * Aig_ManRegPartitionSimple( Aig_Man_t * pAig, int nPartSize, int nOverSize )
{
    Vec_Ptr_t * vResult;
    Vec_Int_t * vPart;
    int i, Counter;
    if ( nOverSize >= nPartSize )
    {
        printf( "Overlap size (%d) is more or equal than the partition size (%d).\n", nOverSize, nPartSize );
        printf( "Adjusting it to be equal to half of the partition size.\n" );
        nOverSize = nPartSize/2;
    }
    assert( nOverSize < nPartSize );
    vResult = Vec_PtrAlloc( 100 );
    for ( Counter = 0; Counter < Aig_ManRegNum(pAig); Counter -= nOverSize )
    {
        vPart = Vec_IntAlloc( nPartSize );
        for ( i = 0; i < nPartSize; i++, Counter++ )
            if ( Counter < Aig_ManRegNum(pAig) )
                Vec_IntPush( vPart, Counter );
        if ( Vec_IntSize(vPart) <= nOverSize )
            Vec_IntFree(vPart);
        else
            Vec_PtrPush( vResult, vPart );
    }
    return vResult;
}